

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O1

string * __thiscall
tinyusdz::crate::GetCrateDataTypeName_abi_cxx11_
          (string *__return_storage_ptr__,crate *this,int32_t type_id)

{
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  allocator local_39;
  undefined1 local_38 [32];
  char local_18;
  
  GetCrateDataType_abi_cxx11_
            ((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                   *)local_38)->m_value,this,type_id);
  if (local_18 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"[Invalid]","");
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(char *)local_38._0_8_,&local_39);
  }
  if ((local_18 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._0_8_ !=
      &(((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
          *)local_38)->m_error).field_2)) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetCrateDataTypeName(int32_t type_id) {
  auto tyRet = GetCrateDataType(type_id);
  if (!tyRet) {
    return "[Invalid]";
  }

  const CrateDataType dty = tyRet.value();
  return dty.name;
}